

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall
Memory::HeapInfo::Initialize
          (HeapInfo *this,Recycler *recycler,
          _func_void_Recycler_ptr_void_ptr_size_t *trackNativeAllocCallBack,
          PageHeapMode pageheapmode,bool captureAllocCallStack,bool captureFreeCallStack)

{
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this_00;
  TBlockAllocatorType *this_01;
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this_02;
  TBlockAllocatorType *this_03;
  uint local_2c;
  uint local_28;
  uint i_1;
  uint i;
  bool captureFreeCallStack_local;
  bool captureAllocCallStack_local;
  PageHeapMode pageheapmode_local;
  _func_void_Recycler_ptr_void_ptr_size_t *trackNativeAllocCallBack_local;
  Recycler *recycler_local;
  HeapInfo *this_local;
  
  Initialize(this,recycler,pageheapmode,captureAllocCallStack,captureFreeCallStack);
  for (local_28 = 0; local_28 < 0x30; local_28 = local_28 + 1) {
    this_00 = (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)
              HeapBucketGroup<SmallAllocationBlockAttributes>::GetBucket<(Memory::ObjectInfoBits)0>
                        (this->heapBuckets + local_28);
    this_01 = HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
              GetAllocator(this_00);
    SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
    SetTrackNativeAllocatedObjectCallBack(this_01,trackNativeAllocCallBack);
  }
  for (local_2c = 0; local_2c < 0x1d; local_2c = local_2c + 1) {
    this_02 = (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *)
              HeapBucketGroup<MediumAllocationBlockAttributes>::GetBucket<(Memory::ObjectInfoBits)0>
                        (this->mediumHeapBuckets + local_2c);
    this_03 = HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
              GetAllocator(this_02);
    SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
    SetTrackNativeAllocatedObjectCallBack(this_03,trackNativeAllocCallBack);
  }
  return;
}

Assistant:

void
HeapInfo::Initialize(Recycler * recycler, void(*trackNativeAllocCallBack)(Recycler *, void *, size_t)
#ifdef RECYCLER_PAGE_HEAP
, PageHeapMode pageheapmode
, bool captureAllocCallStack
, bool captureFreeCallStack
#endif
)
{
    Initialize(recycler
#ifdef RECYCLER_PAGE_HEAP
        , pageheapmode
        , captureAllocCallStack
        , captureFreeCallStack
#endif
        );

    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].GetBucket<NoBit>().GetAllocator()->SetTrackNativeAllocatedObjectCallBack(trackNativeAllocCallBack);
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].GetBucket<NoBit>().GetAllocator()->SetTrackNativeAllocatedObjectCallBack(trackNativeAllocCallBack);
    }
#endif
}